

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_sectors.cxx
# Opt level: O3

void __thiscall
read_sector_v13::operator()(read_sector_v13 *this,sector_data **_sector,xr_reader *r)

{
  uint8_t *puVar1;
  sector_data *dest;
  size_t sVar2;
  
  dest = (sector_data *)operator_new(0x20);
  (dest->portals).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (dest->portals).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (dest->portals).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *_sector = dest;
  sVar2 = xray_re::xr_reader::r_raw_chunk(r,2,dest,4);
  if (sVar2 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_sectors.cxx"
                  ,0x22,"void read_sector_v13::operator()(sector_data *&, xr_reader &) const");
  }
  sVar2 = xray_re::xr_reader::find_chunk(r,1);
  if ((sVar2 & 1) == 0) {
    puVar1 = (r->field_2).m_p;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve(&dest->portals,sVar2 >> 1)
    ;
    std::vector<unsigned_short,std::allocator<unsigned_short>>::_M_assign_aux<unsigned_short_const*>
              ((vector<unsigned_short,std::allocator<unsigned_short>> *)&dest->portals,puVar1,
               puVar1 + sVar2);
    puVar1 = (r->field_2).m_p;
    (r->field_2).m_p = puVar1 + sVar2;
    if (puVar1 + sVar2 <= r->m_end) {
      return;
    }
    __assert_fail("m_p <= m_end",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.h"
                  ,0x7c,"void xray_re::xr_reader::advance(size_t)");
  }
  __assert_fail("size == 0 || (size % sizeof(uint16_t) == 0)",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_sectors.cxx"
                ,0x24,"void read_sector_v13::operator()(sector_data *&, xr_reader &) const");
}

Assistant:

void operator()(sector_data*& _sector, xr_reader& r) const {
	sector_data* sector = new sector_data;
	_sector = sector;
	if (!r.r_chunk(FSP_ROOT, sector->root))
		xr_not_expected();
	size_t size = r.find_chunk(FSP_PORTALS);
	xr_assert(size == 0 || (size % sizeof(uint16_t) == 0));
	r.r_seq(size/sizeof(uint16_t), sector->portals);
}